

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Platform.cpp
# Opt level: O0

uint8_t __thiscall
GmmLib::PlatformInfoGen11::ValidateUnifiedAuxSurface(PlatformInfoGen11 *this,GMM_TEXTURE_INFO *Surf)

{
  GMM_PLATFORM_INFO *pGVar1;
  GMM_TEXTURE_INFO *Surf_local;
  PlatformInfoGen11 *this_local;
  
  if ((((ulong)(Surf->Flags).Gpu >> 0x25 & 1) != 0) &&
     ((((((ulong)(Surf->Flags).Gpu >> 1 & 1) == 0 || (1 < (Surf->MSAA).NumSamples)) ||
       ((((ulong)(Surf->Flags).Gpu >> 0x17 & 1) == 0 &&
        (((ulong)(Surf->Flags).Gpu >> 0x22 & 1) == 0)))) &&
      (((pGVar1 = Context::GetPlatformInfo
                            ((this->super_PlatformInfoGen10).super_PlatformInfo.pGmmLibContext),
        (pGVar1->Platform).eProductFamily != IGFX_LAKEFIELD ||
        (((ulong)(Surf->Flags).Gpu >> 0x10 & 1) == 0)) || (1 < (Surf->MSAA).NumSamples)))))) {
    return '\0';
  }
  return '\x01';
}

Assistant:

uint8_t GmmLib::PlatformInfoGen11::ValidateUnifiedAuxSurface(GMM_TEXTURE_INFO &Surf)
{
    if((Surf.Flags.Gpu.UnifiedAuxSurface) &&
       !( //--- Legitimate UnifiedAuxSurface Case ------------------------------------------
       Surf.Flags.Gpu.CCS &&
       ((Surf.MSAA.NumSamples <= 1 && (Surf.Flags.Gpu.RenderTarget || Surf.Flags.Gpu.Texture))) ||
       ((GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_LAKEFIELD) && Surf.Flags.Gpu.MMC &&
        (Surf.MSAA.NumSamples <= 1))))
    {
        GMM_ASSERTDPF(0, "Invalid UnifiedAuxSurface usage!");
        return 0;
    }
    return 1;
}